

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O2

void __thiscall read_glow_v5::operator()(read_glow_v5 *this,glow_data **_glow,xr_reader *r)

{
  float *pfVar1;
  glow_data *v;
  
  v = (glow_data *)operator_new(0x14);
  *_glow = v;
  xray_re::xr_reader::r_fvector3(r,(fvector3 *)v);
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  v->radius = *pfVar1;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 2);
  v->texture_id = *(uint16_t *)(pfVar1 + 1);
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 3);
  v->shader_id = *(uint16_t *)(pfVar1 + 2);
  return;
}

Assistant:

void operator()(glow_data*& _glow, xr_reader& r) const {
	glow_data* glow = new glow_data;
	_glow = glow;
	r.r_fvector3(glow->position);
	glow->radius = r.r_float();
	glow->texture_id = uint16_t(r.r_u32() & UINT16_MAX);
	glow->shader_id = uint16_t(r.r_u32() & UINT16_MAX);
}